

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

uint __thiscall
ON_SubDEdgeSharpness::SetEdgeChainSharpness
          (ON_SubDEdgeSharpness *this,ON_Interval chain_sharpness_range,uint edge_count,
          ON_SubDEdgeSharpness *chain_edge_sharpness)

{
  bool bVar1;
  double *pdVar2;
  float in_register_00000034;
  double dVar3;
  double dVar4;
  float local_8c;
  double local_80;
  ON_SubDEdgeSharpness local_64;
  ON_SubDEdgeSharpness v;
  uint i_1;
  ON_Interval r;
  double d;
  ON_SubDEdgeSharpness OStack_38;
  uint i;
  ON_SubDEdgeSharpness c;
  ON_SubDEdgeSharpness *chain_edge_sharpness_local;
  undefined1 auStack_20 [4];
  uint edge_count_local;
  ON_Interval chain_sharpness_range_local;
  
  c.m_edge_sharpness[1] = in_register_00000034;
  c.m_edge_sharpness[0] = (float)edge_count;
  chain_sharpness_range_local.m_t[0] = chain_sharpness_range.m_t[1];
  _auStack_20 = chain_sharpness_range.m_t[0];
  local_8c = SUB84(this,0);
  if (((local_8c == 0.0) || (local_8c == -NAN)) || (c.m_edge_sharpness == (float  [2])0x0)) {
    chain_sharpness_range_local.m_t[1]._4_4_ = 0.0;
  }
  else {
    pdVar2 = ON_Interval::operator[]((ON_Interval *)auStack_20,0);
    dVar3 = *pdVar2;
    pdVar2 = ON_Interval::operator[]((ON_Interval *)auStack_20,1);
    if ((dVar3 != *pdVar2) || (NAN(dVar3) || NAN(*pdVar2))) {
      pdVar2 = ON_Interval::operator[]((ON_Interval *)auStack_20,0);
      bVar1 = IsValidValue(*pdVar2,false);
      if (bVar1) {
        pdVar2 = ON_Interval::operator[]((ON_Interval *)auStack_20,1);
        bVar1 = IsValidValue(*pdVar2,false);
        dVar3 = ON_DBL_QNAN;
        if (bVar1) {
          pdVar2 = ON_Interval::operator[]((ON_Interval *)auStack_20,0);
          ON_Interval::ON_Interval((ON_Interval *)(v.m_edge_sharpness + 1),dVar3,*pdVar2);
          for (v.m_edge_sharpness[0] = 1.4013e-45; (uint)v.m_edge_sharpness[0] <= (uint)local_8c;
              v.m_edge_sharpness[0] = (float)((int)v.m_edge_sharpness[0] + 1)) {
            stack0xffffffffffffffa8 = r.m_t[0];
            if ((uint)v.m_edge_sharpness[0] < (uint)local_8c) {
              local_80 = ON_Interval::ParameterAt
                                   ((ON_Interval *)auStack_20,
                                    (double)(uint)v.m_edge_sharpness[0] /
                                    (double)((ulong)this & 0xffffffff));
            }
            else {
              pdVar2 = ON_Interval::operator[]((ON_Interval *)auStack_20,1);
              local_80 = *pdVar2;
            }
            r.m_t[0] = local_80;
            local_64 = FromInterval((ON_Interval *)(v.m_edge_sharpness + 1));
            bVar1 = IsValid(&local_64);
            if (!bVar1) {
              return 0;
            }
            *(float (*) [2])((long)c.m_edge_sharpness + (ulong)((int)v.m_edge_sharpness[0] - 1) * 8)
                 = local_64.m_edge_sharpness;
          }
          dVar3 = EndSharpness((ON_SubDEdgeSharpness *)c.m_edge_sharpness,0);
          dVar4 = EndSharpness((ON_SubDEdgeSharpness *)
                               ((long)c.m_edge_sharpness + (ulong)((int)local_8c - 1) * 8),1);
          if ((dVar3 == dVar4) && (!NAN(dVar3) && !NAN(dVar4))) {
            local_8c = 1.4013e-45;
          }
          chain_sharpness_range_local.m_t[1]._4_4_ = local_8c;
        }
        else {
          chain_sharpness_range_local.m_t[1]._4_4_ = 0.0;
        }
      }
      else {
        chain_sharpness_range_local.m_t[1]._4_4_ = 0.0;
      }
    }
    else {
      pdVar2 = ON_Interval::operator[]((ON_Interval *)auStack_20,0);
      OStack_38 = FromConstant(*pdVar2);
      bVar1 = IsValid(&stack0xffffffffffffffc8,true);
      if (bVar1) {
        for (d._4_4_ = 0.0; (uint)d._4_4_ < (uint)local_8c; d._4_4_ = (float)((int)d._4_4_ + 1)) {
          *(float (*) [2])((long)c.m_edge_sharpness + (ulong)(uint)d._4_4_ * 8) =
               OStack_38.m_edge_sharpness;
        }
        chain_sharpness_range_local.m_t[1]._4_4_ = 1.4013e-45;
      }
      else {
        chain_sharpness_range_local.m_t[1]._4_4_ = 0.0;
      }
    }
  }
  return (uint)chain_sharpness_range_local.m_t[1]._4_4_;
}

Assistant:

unsigned ON_SubDEdgeSharpness::SetEdgeChainSharpness(
  ON_Interval chain_sharpness_range,
  unsigned edge_count,
  ON_SubDEdgeSharpness* chain_edge_sharpness
)
{
  if (edge_count <= 0 || edge_count >= ON_UNSET_UINT_INDEX || nullptr == chain_edge_sharpness)
    return 0;

  if (chain_sharpness_range[0] == chain_sharpness_range[1])
  {
    const ON_SubDEdgeSharpness c = ON_SubDEdgeSharpness::FromConstant(chain_sharpness_range[0]);
    if (false == c.IsValid(true))
      return 0;
    for (unsigned i = 0; i < edge_count; ++i)
      chain_edge_sharpness[i] = c;
    return 1;
  }

  if (false == ON_SubDEdgeSharpness::IsValidValue(chain_sharpness_range[0], false))
    return false;
  if (false == ON_SubDEdgeSharpness::IsValidValue(chain_sharpness_range[1], false))
    return false;

  const double d = (double)edge_count;
  ON_Interval r(ON_DBL_QNAN, chain_sharpness_range[0]);
  for (unsigned i = 1; i <= edge_count; ++i)
  {
    r.m_t[0] = r.m_t[1];
    r.m_t[1]
      = (i < edge_count)
      ? chain_sharpness_range.ParameterAt(((double)i / d))
      : chain_sharpness_range[1];
    const ON_SubDEdgeSharpness v = ON_SubDEdgeSharpness::FromInterval(r);
    if (v.IsValid())
    {
      chain_edge_sharpness[i - 1] = v;
      continue;
    }
    return 0;
  }

  return
    (chain_edge_sharpness[0].EndSharpness(0) != chain_edge_sharpness[edge_count - 1].EndSharpness(1))
    ? edge_count
    : 1;
}